

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaItemListPtr xmlSchemaItemListCreate(void)

{
  xmlSchemaItemListPtr ret;
  
  ret = (xmlSchemaItemListPtr)(*xmlMalloc)(0x10);
  if (ret == (xmlSchemaItemListPtr)0x0) {
    xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0);
    ret = (xmlSchemaItemListPtr)0x0;
  }
  else {
    memset(ret,0,0x10);
  }
  return ret;
}

Assistant:

static xmlSchemaItemListPtr
xmlSchemaItemListCreate(void)
{
    xmlSchemaItemListPtr ret;

    ret = xmlMalloc(sizeof(xmlSchemaItemList));
    if (ret == NULL) {
	xmlSchemaPErrMemory(NULL);
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaItemList));
    return (ret);
}